

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

internals ** __thiscall pybind11::capsule::get_pointer<pybind11::detail::internals*>(capsule *this)

{
  undefined8 uVar1;
  internals **ppiVar2;
  
  uVar1 = PyCapsule_GetName((this->super_object).super_handle.m_ptr);
  ppiVar2 = (internals **)PyCapsule_GetPointer((this->super_object).super_handle.m_ptr,uVar1);
  if (ppiVar2 != (internals **)0x0) {
    return ppiVar2;
  }
  PyErr_Clear();
  pybind11_fail("Unable to extract capsule contents!");
}

Assistant:

T* get_pointer() const {
        auto name = this->name();
        T *result = static_cast<T *>(PyCapsule_GetPointer(m_ptr, name));
        if (!result) {
            PyErr_Clear();
            pybind11_fail("Unable to extract capsule contents!");
        }
        return result;
    }